

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

void next_field(char **p,size_t *l,char **start,char **end,char *sep)

{
  bool bVar1;
  char *sep_local;
  char **end_local;
  char **start_local;
  size_t *l_local;
  char **p_local;
  
  while( true ) {
    bVar1 = false;
    if (((*l != 0) && (bVar1 = true, **p != ' ')) && (bVar1 = true, **p != '\t')) {
      bVar1 = **p == '\n';
    }
    if (!bVar1) break;
    *p = *p + 1;
    *l = *l - 1;
  }
  *start = *p;
  while( true ) {
    bVar1 = false;
    if ((((*l != 0) && (bVar1 = false, **p != ' ')) &&
        ((bVar1 = false, **p != '\t' &&
         ((bVar1 = false, **p != '\n' && (bVar1 = false, **p != ',')))))) &&
       (bVar1 = false, **p != ':')) {
      bVar1 = **p != '#';
    }
    if (!bVar1) break;
    *p = *p + 1;
    *l = *l - 1;
  }
  *end = *p;
  while( true ) {
    bVar1 = false;
    if ((((*l != 0) && (bVar1 = false, **p != ',')) && (bVar1 = false, **p != ':')) &&
       (bVar1 = false, **p != '\n')) {
      bVar1 = **p != '#';
    }
    if (!bVar1) break;
    *p = *p + 1;
    *l = *l - 1;
  }
  *sep = **p;
  if (*sep == '#') {
    while( true ) {
      bVar1 = false;
      if ((*l != 0) && (bVar1 = false, **p != ',')) {
        bVar1 = **p != '\n';
      }
      if (!bVar1) break;
      *p = *p + 1;
      *l = *l - 1;
    }
    *sep = **p;
  }
  if (*l != 0) {
    *p = *p + 1;
    *l = *l - 1;
  }
  return;
}

Assistant:

static void
next_field(const char **p, size_t *l, const char **start,
    const char **end, char *sep)
{
	/* Skip leading whitespace to find start of field. */
	while (*l > 0 && (**p == ' ' || **p == '\t' || **p == '\n')) {
		(*p)++;
		(*l)--;
	}
	*start = *p;

	/* Locate end of field, trim trailing whitespace if necessary */
	while (*l > 0 && **p != ' ' && **p != '\t' && **p != '\n' && **p != ',' && **p != ':' && **p != '#') {
		(*p)++;
		(*l)--;
	}
	*end = *p;

	/* Scan for the separator. */
	while (*l > 0 && **p != ',' && **p != ':' && **p != '\n' && **p != '#') {
		(*p)++;
		(*l)--;
	}
	*sep = **p;

	/* Handle in-field comments */
	if (*sep == '#') {
		while (*l > 0 && **p != ',' && **p != '\n') {
			(*p)++;
			(*l)--;
		}
		*sep = **p;
	}

	/* Skip separator. */
	if (*l > 0) {
		(*p)++;
		(*l)--;
	}
}